

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddProperties<std::__cxx11::string,std::__cxx11::string,double,double,double>
          (Node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more,double more_1,
          double more_2,double more_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  double local_38;
  double more_local_3;
  double more_local_2;
  double more_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  Node *this_local;
  
  local_38 = more_3;
  more_local_3 = more_2;
  more_local_2 = more_1;
  more_local_1 = (double)more;
  more_local = value;
  value_local = &this->name;
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::__cxx11::string&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&this->properties,value);
  std::__cxx11::string::string((string *)&local_58,(string *)more);
  AddProperties<std::__cxx11::string,double,double,double>
            (this,&local_58,more_local_2,more_local_3,local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void AddProperties(T value, More... more) {
        properties.emplace_back(value);
        AddProperties(more...);
    }